

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestMissingInput::Run(BuildTestMissingInput *this)

{
  Test *pTVar1;
  bool condition;
  Node *pNVar2;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  BuildTestMissingInput *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"in1",&local_51);
  BuildTest::Dirty(&this->super_BuildTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"cat1",&local_89);
  pNVar2 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_88,(string *)local_30);
  testing::Test::Check
            (pTVar1,pNVar2 == (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x37e,"builder_.AddTarget(\"cat1\", &err)");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pTVar1 = g_current_test;
  condition = std::operator==("\'in1\', needed by \'cat1\', missing and no known rule to make it",
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x380,"\"\'in1\', needed by \'cat1\', missing and no known rule to make it\" == err");
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTest, MissingInput) {
  // Input is referenced by build file, but no rule for it.
  string err;
  Dirty("in1");
  EXPECT_FALSE(builder_.AddTarget("cat1", &err));
  EXPECT_EQ("'in1', needed by 'cat1', missing and no known rule to make it",
            err);
}